

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O2

void SVGChart::FindRange(PlotDataBase *inData,float inMin,float inMax,long *outStartIndex,
                        long *outEndIndex)

{
  long lVar1;
  long lVar2;
  float fVar3;
  
  lVar2 = 0;
  while( true ) {
    *outStartIndex = lVar2;
    lVar1 = PlotDataBase::GetSize(inData);
    if (lVar1 <= lVar2) break;
    fVar3 = PlotDataBase::GetValue(inData,*outStartIndex);
    if (inMin < fVar3) break;
    lVar2 = *outStartIndex + 1;
  }
  lVar2 = *outStartIndex;
  lVar1 = PlotDataBase::GetSize(inData);
  if (lVar2 == lVar1) {
    lVar2 = PlotDataBase::GetSize(inData);
    *outStartIndex = lVar2 + -1;
    *outEndIndex = lVar2 + -1;
    if (*outStartIndex < 0) {
      __assert_fail("outStartIndex>-1",
                    "/workspace/llm4binary/github/license_c_cmakelists/davecom[P]SVGChart/PPlot.cpp"
                    ,0x59e,
                    "void SVGChart::FindRange(const PlotDataBase &, float, float, long &, long &)");
    }
  }
  else {
    lVar2 = *outStartIndex;
    if (0 < lVar2) {
      lVar2 = lVar2 + -1;
      *outStartIndex = lVar2;
    }
    while( true ) {
      *outEndIndex = lVar2;
      lVar1 = PlotDataBase::GetSize(inData);
      if (lVar1 <= lVar2) break;
      fVar3 = PlotDataBase::GetValue(inData,*outEndIndex);
      if (inMax <= fVar3) break;
      lVar2 = *outEndIndex + 1;
    }
    lVar2 = *outEndIndex;
    lVar1 = PlotDataBase::GetSize(inData);
    if (lVar2 == lVar1) {
      *outEndIndex = *outEndIndex + -1;
    }
    if (*outStartIndex < 0) {
      __assert_fail("outStartIndex>-1",
                    "/workspace/llm4binary/github/license_c_cmakelists/davecom[P]SVGChart/PPlot.cpp"
                    ,0x5af,
                    "void SVGChart::FindRange(const PlotDataBase &, float, float, long &, long &)");
    }
  }
  return;
}

Assistant:

void FindRange (const PlotDataBase &inData, float inMin, float inMax, long& outStartIndex, long& outEndIndex) {
        outStartIndex = 0;
        while (outStartIndex < inData.GetSize () && inData.GetValue (outStartIndex) <= inMin) {
            outStartIndex++;
        }

        if (outStartIndex == inData.GetSize ()) {
            outStartIndex = inData.GetSize () - 1;
            outEndIndex = outStartIndex;
            assert (outStartIndex>-1);
            return;
        }

        // We want the value at outStartIndex smaller than or equal to inMin
        if (outStartIndex > 0) {
            outStartIndex--;
        }

        outEndIndex = outStartIndex;
        while (outEndIndex < inData.GetSize () && inData.GetValue (outEndIndex) < inMax) {
            outEndIndex++;
        }

        if (outEndIndex == inData.GetSize ()) {
            outEndIndex--;
        }
        assert (outStartIndex>-1);
    }